

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O1

int __thiscall kj::_::Debug::Fault::init(Fault *this,EVP_PKEY_CTX *ctx)

{
  ArrayPtr<kj::String> argValues;
  size_t sVar1;
  uint uVar2;
  Exception *this_00;
  ulong uVar3;
  uint in_ECX;
  int in_EDX;
  Type type;
  DescriptionStyle in_R8D;
  char *in_R9;
  char *pcVar4;
  char *in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined4 in_stack_ffffffffffffffa8;
  String local_48;
  
  pcVar4 = in_R9;
  this_00 = (Exception *)operator_new(400);
  type = OVERLOADED;
  uVar3 = (ulong)(in_ECX - 0x57);
  if (in_ECX - 0x57 < 0x24) {
    if ((0x713e000UL >> (uVar3 & 0x3f) & 1) == 0) {
      if ((0x800840001U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_001cb87e;
      if ((0x122UL >> (uVar3 & 0x3f) & 1) == 0) goto LAB_001cb847;
LAB_001cb879:
      type = UNIMPLEMENTED;
      goto LAB_001cb87e;
    }
LAB_001cb825:
    type = DISCONNECTED;
  }
  else {
LAB_001cb847:
    uVar3 = (ulong)(in_ECX - 0xc);
    if (in_ECX - 0xc < 0x35) {
      if ((0x2011801UL >> (uVar3 & 0x3f) & 1) != 0) goto LAB_001cb87e;
      if ((0x10000000100000U >> (uVar3 & 0x3f) & 1) != 0) goto LAB_001cb825;
      if (uVar3 == 0x1a) goto LAB_001cb879;
    }
    type = FAILED;
  }
LAB_001cb87e:
  argValues.size_._0_4_ = in_stack_ffffffffffffffa8;
  argValues.ptr = (String *)in_stack_00000010;
  argValues.size_._4_4_ = in_EDX;
  anon_unknown_2::makeDescriptionImpl
            (&local_48,(anon_unknown_2 *)0x2,in_R8D,(char *)(ulong)in_ECX,(int)in_R9,pcVar4,
             in_stack_00000008,argValues);
  Exception::Exception(this_00,type,(char *)ctx,in_EDX,&local_48);
  sVar1 = local_48.content.size_;
  pcVar4 = local_48.content.ptr;
  this->exception = this_00;
  if (local_48.content.ptr != (char *)0x0) {
    local_48.content.ptr = (char *)0x0;
    local_48.content.size_ = 0;
    uVar2 = (**(local_48.content.disposer)->_vptr_ArrayDisposer)
                      (local_48.content.disposer,pcVar4,1,sVar1,sVar1,0);
    this = (Fault *)(ulong)uVar2;
  }
  return (int)this;
}

Assistant:

void Debug::Fault::init(
    const char* file, int line, int osErrorNumber,
    const char* condition, const char* macroArgs, ArrayPtr<String> argValues) {
  exception = new Exception(typeOfErrno(osErrorNumber), file, line,
      makeDescriptionImpl(SYSCALL, condition, osErrorNumber, nullptr, macroArgs, argValues));
}